

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::Map<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>,void>
               (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *container,ostream *os)

{
  bool bVar1;
  reference value;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *)0x0;
  google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>::begin
            ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,container);
  google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>::end
            ((const_iterator *)&elem,container);
  do {
    bVar1 = google::protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar1) {
LAB_00af1f95:
      if (__range3 != (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>::
            const_iterator::operator*
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    if ((__range3 != (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_00af1f95;
    }
    std::operator<<(os,' ');
    UniversalPrint<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>>(value,os);
    __range3 = (Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *)
               ((long)&(__range3->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_elements_
               + 1);
    google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>::const_iterator::
    operator++((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }